

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

void __thiscall Engine::newDecisionLevel(Engine *this)

{
  uint uVar1;
  ostream *poVar2;
  int iVar3;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&trail_inc;
  local_50._M_string_length._0_4_ = trail_inc.v;
  iVar3 = trail_inc.v + 1;
  local_50._M_string_length._4_4_ = 4;
  vec<TrailElem>::push(&engine.trail,(TrailElem *)&local_50);
  trail_inc.v = iVar3;
  if (so.debug == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Engine::newDecisionLevel\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"  trail_lim size is currently ",0x1e);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  pushing ",10);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," to trail_lim\n",0xe);
  }
  local_50._M_dataplus._M_p._0_4_ = (this->trail).sz;
  vec<int>::push(&this->trail_lim,(int *)&local_50);
  if (so.debug == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"trail_lim is now: ",0x12);
    showVec_abi_cxx11_(&local_50,&this->trail_lim);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_50._M_dataplus._M_p,
                        CONCAT44(local_50._M_string_length._4_4_,(int)local_50._M_string_length));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  vec<vec<Lit>_>::push(&sat.trail);
  local_50._M_dataplus._M_p = local_50._M_dataplus._M_p & 0xffffffff00000000;
  vec<int>::push(&sat.qhead,(int *)&local_50);
  vec<vec<Clause_*>_>::push(&sat.rtrail);
  if (so.mip == true) {
    MIP::newDecisionLevel(mip);
  }
  uVar1 = (this->trail_lim).sz;
  if ((int)uVar1 < this->peak_depth) {
    uVar1 = this->peak_depth;
  }
  this->peak_depth = uVar1;
  return;
}

Assistant:

inline void Engine::newDecisionLevel() {
	trail_inc++;
	if (so.debug) {
		std::cerr << "Engine::newDecisionLevel\n";
		std::cerr << "  trail_lim size is currently " << trail_lim.size() << "\n";
		std::cerr << "  pushing " << trail.size() << " to trail_lim\n";
	}
	trail_lim.push(trail.size());
	if (so.debug) {
		std::cerr << "trail_lim is now: " << showVec(trail_lim) << "\n";
	}
	sat.newDecisionLevel();
	if (so.mip) {
		mip->newDecisionLevel();
	}
	assert(static_cast<int>(dec_info.size()) == decisionLevel());
	peak_depth = std::max(peak_depth, decisionLevel());
}